

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# separator.cpp
# Opt level: O3

void __thiscall ftxui::SeparatorWithPixel::Render(SeparatorWithPixel *this,Screen *screen)

{
  bool bVar1;
  Color CVar2;
  int iVar3;
  Pixel *pPVar4;
  int iVar5;
  int x;
  int y;
  
  y = (this->super_Separator).super_Node.box_.y_min;
  iVar3 = (this->super_Separator).super_Node.box_.y_max;
  if (y <= iVar3) {
    iVar5 = (this->super_Separator).super_Node.box_.x_max;
    do {
      x = (this->super_Separator).super_Node.box_.x_min;
      if (x <= iVar5) {
        do {
          pPVar4 = Screen::PixelAt(screen,x,y);
          std::__cxx11::string::_M_assign((string *)pPVar4);
          pPVar4->field_0x28 = (this->pixel_).field_0x28;
          CVar2 = (this->pixel_).foreground_color;
          pPVar4->background_color = (this->pixel_).background_color;
          pPVar4->foreground_color = CVar2;
          iVar5 = (this->super_Separator).super_Node.box_.x_max;
          bVar1 = x < iVar5;
          x = x + 1;
        } while (bVar1);
        iVar3 = (this->super_Separator).super_Node.box_.y_max;
      }
      bVar1 = y < iVar3;
      y = y + 1;
    } while (bVar1);
  }
  return;
}

Assistant:

void Render(Screen& screen) override {
    for (int y = box_.y_min; y <= box_.y_max; ++y) {
      for (int x = box_.x_min; x <= box_.x_max; ++x) {
        screen.PixelAt(x, y) = pixel_;
      }
    }
  }